

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus_test.c
# Opt level: O2

void test_bus_cooked(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  nng_socket local_28;
  _Bool local_21;
  nng_socket s;
  _Bool b;
  
  nVar1 = nng_bus0_open(&local_28);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x17d,"%s: expected success, got %s (%d)","nng_bus0_open(&s)",pcVar3,nVar1
                        );
  if (iVar2 != 0) {
    nVar1 = nng_socket_raw(local_28,&local_21);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                           ,0x17e,"%s: expected success, got %s (%d)","nng_socket_raw(s, &b)",pcVar3
                           ,nVar1);
    if (iVar2 != 0) {
      acutest_check_(local_21 ^ 1,
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                     ,0x17f,"%s","!b");
      nVar1 = nng_socket_close(local_28);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                             ,0x180,"%s: expected success, got %s (%d)","nng_socket_close(s)",pcVar3
                             ,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_bus0_open_raw(&local_28);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                               ,0x183,"%s: expected success, got %s (%d)","nng_bus0_open_raw(&s)",
                               pcVar3,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_socket_raw(local_28,&local_21);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                                 ,0x184,"%s: expected success, got %s (%d)","nng_socket_raw(s, &b)",
                                 pcVar3,nVar1);
          if (iVar2 != 0) {
            acutest_check_((uint)local_21,
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                           ,0x185,"%s","b");
            nVar1 = nng_socket_close(local_28);
            pcVar3 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                                   ,0x186,"%s: expected success, got %s (%d)","nng_socket_close(s)",
                                   pcVar3,nVar1);
            if (iVar2 != 0) {
              return;
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_bus_cooked(void)
{
	nng_socket s;
	bool       b;

	NUTS_PASS(nng_bus0_open(&s));
	NUTS_PASS(nng_socket_raw(s, &b));
	NUTS_TRUE(!b);
	NUTS_CLOSE(s);

	// raw pub only differs in the option setting
	NUTS_PASS(nng_bus0_open_raw(&s));
	NUTS_PASS(nng_socket_raw(s, &b));
	NUTS_TRUE(b);
	NUTS_CLOSE(s);
}